

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
     ::main(void)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  complex<long_double> *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  longdouble lVar10;
  longdouble lVar11;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZVec<int> NumConnected;
  TPZFMatrix<std::complex<long_double>_> KEl1;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  TestFront;
  TPZFMatrix<std::complex<long_double>_> local_4d0;
  longdouble local_43c;
  _func_int **local_430;
  _func_int **local_428;
  TPZVec<long> local_420;
  TPZVec<long> local_400;
  TPZVec<long> local_3e0;
  TPZVec<int> local_3c0;
  TPZFMatrix<std::complex<long_double>_> local_3a0;
  TPZFMatrix<std::complex<long_double>_> local_310;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  local_280;
  
  local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 2;
  local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 2;
  local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  local_3a0.fElem = (complex<long_double> *)0x0;
  local_3a0.fGiven = (complex<long_double> *)0x0;
  lVar9 = 0;
  local_3a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_3a0.fPivot.super_TPZVec<int>,0);
  local_3a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3a0.fPivot.super_TPZVec<int>.fStore = local_3a0.fPivot.fExtAlloc;
  local_3a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  local_3a0.fWork.fStore = (complex<long_double> *)0x0;
  local_3a0.fWork.fNElements = 0;
  local_3a0.fWork.fNAlloc = 0;
  local_3a0.fElem = (complex<long_double> *)operator_new__(0x80);
  do {
    *(longdouble *)((long)(local_3a0.fElem)->_M_value + lVar9) = (longdouble)0;
    *(longdouble *)((long)(local_3a0.fElem)->_M_value + lVar9 + 0x10) = (longdouble)0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x80);
  if ((local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (longdouble)4.0;
  *(longdouble *)(local_3a0.fElem)->_M_value = lVar10;
  *(longdouble *)((long)(local_3a0.fElem)->_M_value + 0x10) = (longdouble)0;
  if ((local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar11 = (longdouble)6.0;
  *(longdouble *)
   local_3a0.fElem[local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow].
   _M_value = lVar11;
  *(longdouble *)
   ((long)local_3a0.fElem
          [local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow]._M_value
   + 0x10) = (longdouble)0;
  if (local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 1 ||
      local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 2) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)local_3a0.fElem[1]._M_value = lVar11;
  *(longdouble *)(local_3a0.fElem[1]._M_value + 0x10) = (longdouble)0;
  if (local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 2) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_43c = (longdouble)12.0;
  *(longdouble *)
   local_3a0.fElem
   [local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1]._M_value =
       local_43c;
  *(longdouble *)
   ((long)local_3a0.fElem
          [local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1].
          _M_value + 0x10) = (longdouble)0;
  TPZVec<long>::TPZVec(&local_3e0,2);
  *local_3e0.fStore = 0;
  local_3e0.fStore[1] = 1;
  local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 4;
  local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 4;
  local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  local_4d0.fElem = (complex<long_double> *)0x0;
  local_4d0.fGiven = (complex<long_double> *)0x0;
  local_4d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_4d0.fPivot.super_TPZVec<int>,0);
  local_4d0.fPivot.super_TPZVec<int>.fStore = local_4d0.fPivot.fExtAlloc;
  local_4d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_4d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181e7c0;
  local_4d0.fWork.fStore = (complex<long_double> *)0x0;
  local_4d0.fWork.fNElements = 0;
  local_4d0.fWork.fNAlloc = 0;
  local_4d0.fElem = (complex<long_double> *)operator_new__(0x200);
  lVar9 = 0;
  do {
    *(longdouble *)((long)(local_4d0.fElem)->_M_value + lVar9) = (longdouble)0;
    *(longdouble *)((long)(local_4d0.fElem)->_M_value + lVar9 + 0x10) = (longdouble)0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x200);
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)(local_4d0.fElem)->_M_value = lVar10;
  *(longdouble *)((long)(local_4d0.fElem)->_M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem[local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow].
   _M_value = (longdouble)-6.0;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow]._M_value
   + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2]._M_value =
       (longdouble)2.0;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3]._M_value =
       lVar11;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1]._M_value =
       local_43c;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2 + 1]._M_value
       = (longdouble)-6.0;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2 + 1].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 2) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 1]._M_value
       = (longdouble)-12.0;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 1].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 3) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2 + 2]._M_value
       = lVar10;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 2 + 2].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 3) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 2]._M_value
       = lVar11;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 2].
          _M_value + 0x10) = (longdouble)0;
  if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 4) ||
     (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_430 = (_func_int **)&PTR__TPZVec_0181e7c0;
  local_428 = (_func_int **)&PTR__TPZManVector_01815498;
  *(longdouble *)
   local_4d0.fElem
   [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 3]._M_value
       = local_43c;
  *(longdouble *)
   ((long)local_4d0.fElem
          [local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow * 3 + 3].
          _M_value + 0x10) = (longdouble)0;
  lVar8 = 0;
  lVar7 = 0;
  lVar9 = lVar8;
  lVar6 = lVar7;
  do {
    do {
      if (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol <= lVar7 ||
          local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow <= lVar6) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow <= lVar7)
         || (local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol <= lVar6
            )) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar5 = local_4d0.fElem +
               lVar6 + local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
                       fRow * lVar7;
      uVar2 = *(undefined8 *)pcVar5->_M_value;
      uVar3 = *(undefined8 *)((long)pcVar5->_M_value + 8);
      uVar4 = *(undefined8 *)((long)pcVar5->_M_value + 0x18);
      puVar1 = (undefined8 *)
               ((long)(local_4d0.fElem)->_M_value +
               lVar8 + 0x10 +
               local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow *
               lVar9);
      *puVar1 = *(undefined8 *)((long)pcVar5->_M_value + 0x10);
      puVar1[1] = uVar4;
      puVar1 = (undefined8 *)
               ((long)(local_4d0.fElem)->_M_value +
               lVar8 + local_4d0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
                       fRow * lVar9);
      *puVar1 = uVar2;
      puVar1[1] = uVar3;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar7 != 4);
    lVar7 = lVar6 + 1;
    lVar8 = lVar9 + 0x20;
    lVar9 = lVar8;
    lVar6 = lVar7;
  } while (lVar7 != 4);
  TPZVec<long>::TPZVec(&local_400,4);
  *local_400.fStore = 0;
  local_400.fStore[1] = 1;
  local_400.fStore[2] = 2;
  local_400.fStore[3] = 3;
  local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow = 2;
  local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol = 2;
  local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181e4d0;
  local_310.fElem = (complex<long_double> *)0x0;
  local_310.fGiven = (complex<long_double> *)0x0;
  local_310.fSize = 0;
  TPZVec<int>::TPZVec(&local_310.fPivot.super_TPZVec<int>,0);
  local_310.fPivot.super_TPZVec<int>.fStore = local_310.fPivot.fExtAlloc;
  local_310.fPivot.super_TPZVec<int>._vptr_TPZVec = local_428;
  local_310.fPivot.super_TPZVec<int>.fNElements = 0;
  local_310.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_310.fWork._vptr_TPZVec = local_430;
  local_310.fWork.fStore = (complex<long_double> *)0x0;
  local_310.fWork.fNElements = 0;
  local_310.fWork.fNAlloc = 0;
  local_310.fElem = (complex<long_double> *)operator_new__(0x80);
  lVar9 = 0;
  do {
    *(longdouble *)((long)(local_310.fElem)->_M_value + lVar9) = (longdouble)0;
    *(longdouble *)((long)(local_310.fElem)->_M_value + lVar9 + 0x10) = (longdouble)0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x80);
  if ((local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar10 = (longdouble)3.0;
  *(longdouble *)(local_310.fElem)->_M_value = lVar10;
  *(longdouble *)((long)(local_310.fElem)->_M_value + 0x10) = (longdouble)0;
  if ((local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow < 1) ||
     (local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *(longdouble *)
   local_310.fElem[local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow].
   _M_value = lVar10;
  *(longdouble *)
   ((long)local_310.fElem
          [local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow]._M_value
   + 0x10) = (longdouble)0;
  if ((1 < local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow) &&
     (0 < local_3a0.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol)) {
    *(longdouble *)local_3a0.fElem[1]._M_value = lVar10;
    *(longdouble *)(local_3a0.fElem[1]._M_value + 0x10) = (longdouble)0;
    if ((1 < local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow) &&
       (1 < local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol)) {
      *(longdouble *)
       local_310.fElem
       [local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1]._M_value
           = lVar11;
      *(longdouble *)
       ((long)local_310.fElem
              [local_310.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + 1].
              _M_value + 0x10) = (longdouble)0;
      TPZVec<long>::TPZVec(&local_420,2);
      *local_420.fStore = 2;
      local_420.fStore[1] = 3;
      TPZFrontMatrix(&local_280,4);
      TPZVec<int>::TPZVec(&local_3c0,4);
      local_3c0.fStore[0] = 2;
      local_3c0.fStore[1] = 2;
      local_3c0.fStore[2] = 2;
      local_3c0.fStore[3] = 2;
      SetNumElConnected(&local_280,&local_3c0);
      SymbolicAddKel(&local_280,&local_3e0);
      SymbolicAddKel(&local_280,&local_400);
      SymbolicAddKel(&local_280,&local_420);
      TPZFrontSym<std::complex<long_double>_>::AllocData(&local_280.fFront);
      local_280.fLastDecomposed = -1;
      SetNumElConnected(&local_280,&local_3c0);
      AddKel(&local_280,&local_3a0,&local_3e0);
      AddKel(&local_280,&local_4d0,&local_400);
      AddKel(&local_280,&local_310,&local_420);
      local_3c0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_3c0.fStore != (int *)0x0) {
        operator_delete__(local_3c0.fStore);
      }
      ~TPZFrontMatrix(&local_280,
                      &TPZFrontMatrix<std::complex<long_double>,TPZFileEqnStorage<std::complex<long_double>>,TPZFrontSym<std::complex<long_double>>>
                       ::VTT);
      local_420._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_420.fStore != (long *)0x0) {
        operator_delete__(local_420.fStore);
      }
      TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_310);
      local_400._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_400.fStore != (long *)0x0) {
        operator_delete__(local_400.fStore);
      }
      TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_4d0);
      local_3e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_3e0.fStore != (long *)0x0) {
        operator_delete__(local_3e0.fStore);
      }
      TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_3a0);
      return;
    }
    TPZFMatrix<std::complex<long_double>_>::Error
              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<std::complex<long_double>_>::Error
            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}